

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O3

LY_ERR ly_vlog_build_path_line(ly_ctx *ctx,char **data_path,char **schema_path,uint64_t *line)

{
  uint uVar1;
  LY_ERR LVar2;
  int iVar3;
  LY_ERR extraout_EAX;
  long lVar4;
  char *pcVar6;
  ulong extraout_RAX;
  char *path;
  char *local_30;
  ulong uVar5;
  
  *data_path = (char *)0x0;
  *schema_path = (char *)0x0;
  *line = 0;
  lVar4 = __tls_get_addr(&PTR_001fffa0);
  if (*(int *)(lVar4 + 0x24) == 0) {
    if (*(int *)(lVar4 + 0x14) != 0) {
      pcVar6 = lysc_path(*(lysc_node **)
                          (*(long *)(lVar4 + 0x18) + (ulong)(*(int *)(lVar4 + 0x14) - 1) * 8),
                         LYSC_PATH_LOG,(char *)0x0,0);
      *schema_path = pcVar6;
      if (pcVar6 == (char *)0x0) {
        ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_vlog_build_path_line");
        return extraout_EAX;
      }
    }
  }
  else {
    LVar2 = ly_vlog_build_data_path(ctx,data_path);
    uVar5 = (ulong)LVar2;
    if (LVar2 != LY_SUCCESS) goto LAB_00110e57;
  }
  if ((*(int *)(lVar4 + 0x34) != 0) &&
     (pcVar6 = *(char **)(*(long *)(lVar4 + 0x38) + (ulong)(*(int *)(lVar4 + 0x34) - 1) * 8),
     *pcVar6 != '\0')) {
    if ((*data_path == (char *)0x0) && (*schema_path == (char *)0x0)) {
      iVar3 = asprintf(&local_30,"%s",pcVar6);
    }
    else {
      iVar3 = asprintf(&local_30,"%s%s");
    }
    if (iVar3 == -1) {
      ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_vlog_build_path_line");
      uVar5 = extraout_RAX;
      goto LAB_00110e57;
    }
    if (*data_path == (char *)0x0) {
      free(*schema_path);
      *schema_path = local_30;
    }
    else {
      free(*data_path);
      *data_path = local_30;
    }
  }
  uVar1 = *(uint *)(lVar4 + 4);
  uVar5 = (ulong)uVar1;
  if (uVar1 != 0) {
    uVar5 = *(ulong *)(*(long *)(*(long *)(lVar4 + 8) + (ulong)(uVar1 - 1) * 8) + 0x38);
    *line = uVar5;
  }
LAB_00110e57:
  return (LY_ERR)uVar5;
}

Assistant:

static LY_ERR
ly_vlog_build_path_line(const struct ly_ctx *ctx, char **data_path, char **schema_path, uint64_t *line)
{
    int r;
    char *path;

    *data_path = NULL;
    *schema_path = NULL;
    *line = 0;

    /* data/schema node */
    if (log_location.dnodes.count) {
        LY_CHECK_RET(ly_vlog_build_data_path(ctx, data_path));
    } else if (log_location.scnodes.count) {
        *schema_path = lysc_path(log_location.scnodes.objs[log_location.scnodes.count - 1], LYSC_PATH_LOG, NULL, 0);
        LY_CHECK_ERR_RET(!*schema_path, LOGMEM(ctx), LY_EMEM);
    }

    if (log_location.paths.count && ((const char *)(log_location.paths.objs[log_location.paths.count - 1]))[0]) {
        /* append the provided path string to data/schema path, if any */
        if (*data_path) {
            r = asprintf(&path, "%s%s", *data_path, (char *)log_location.paths.objs[log_location.paths.count - 1]);
        } else if (*schema_path) {
            r = asprintf(&path, "%s%s", *schema_path, (char *)log_location.paths.objs[log_location.paths.count - 1]);
        } else {
            r = asprintf(&path, "%s", (char *)log_location.paths.objs[log_location.paths.count - 1]);
        }
        LY_CHECK_ERR_RET(r == -1, LOGMEM(ctx), LY_EMEM);

        if (*data_path) {
            free(*data_path);
            *data_path = path;
        } else {
            free(*schema_path);
            *schema_path = path;
        }
    }

    /* line */
    if (log_location.inputs.count) {
        *line = ((struct ly_in *)log_location.inputs.objs[log_location.inputs.count - 1])->line;
    }

    return LY_SUCCESS;
}